

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

bool __thiscall HighsMipSolverData::checkLimits(HighsMipSolverData *this,int64_t nodeOffset)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  ulong __nbytes;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  HighsMipSolverData *in_RSI;
  long *in_RDI;
  double extraout_XMM0_Qa;
  bool reached_objective_target;
  int int_sense;
  HighsOptions *options;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  allocator local_41;
  string local_40 [16];
  string *in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  ulong uVar4;
  bool local_1;
  
  __nbytes = *(ulong *)(*in_RDI + 8);
  uVar4 = __nbytes;
  if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) &&
     (bVar2 = std::function::operator_cast_to_bool
                        ((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
                          *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)),
     in_RDX = extraout_RDX, bVar2)) {
    HighsCallback::clearHighsCallbackDataOut(*(HighsCallback **)*in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"MIP check limits",&local_41);
    bVar3 = interruptFromCallbackWithData
                      (in_RSI,(int)(uVar4 >> 0x20),in_stack_ffffffffffffffd8,
                       in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    in_RDX = extraout_RDX_00;
    if ((bVar3 & 1) != 0) {
      if (*(int *)(*in_RDI + 0x20) == 0) {
        highsLogDev((HighsLogOptions *)(uVar4 + 0x380),kInfo,"User interrupt\n");
        *(undefined4 *)(*in_RDI + 0x20) = 0x11;
      }
      return true;
    }
  }
  if ((((*(byte *)(*in_RDI + 0xb0) & 1) == 0) &&
      (*(double *)(*in_RDI + 0x40) <= INFINITY && *(double *)(*in_RDI + 0x40) != INFINITY)) &&
     (-INFINITY < *(double *)(uVar4 + 0x148))) {
    uVar1 = *(uint *)(*(long *)(*in_RDI + 0x18) + 0xf0);
    __nbytes = (ulong)uVar1;
    if ((double)(int)uVar1 * *(double *)(*in_RDI + 0x40) <
        (double)(int)uVar1 * *(double *)(uVar4 + 0x148)) {
      if (*(int *)(*in_RDI + 0x20) == 0) {
        highsLogDev((HighsLogOptions *)(uVar4 + 0x380),kInfo,"Reached objective target\n");
        *(undefined4 *)(*in_RDI + 0x20) = 0xc;
      }
      return true;
    }
  }
  if ((*(int *)(uVar4 + 0x2fc) == 0x7fffffff) ||
     (__nbytes = (ulong)*(int *)(uVar4 + 0x2fc),
     (long)&in_RSI->mipsolver + in_RDI[0xce6] < (long)__nbytes)) {
    if ((*(int *)(uVar4 + 0x308) == 0x7fffffff) ||
       (__nbytes = (ulong)*(int *)(uVar4 + 0x308), in_RDI[0xce7] < (long)__nbytes)) {
      if ((*(int *)(uVar4 + 0x30c) == 0x7fffffff) ||
         (__nbytes = uVar4, (int)in_RDI[0xcf6] < *(int *)(uVar4 + 0x30c))) {
        if ((INFINITY < *(double *)(uVar4 + 0x88) || *(double *)(uVar4 + 0x88) == INFINITY) ||
           (HighsTimer::read((HighsTimer *)(*in_RDI + 0x168),0,in_RDX,__nbytes),
           extraout_XMM0_Qa < *(double *)(uVar4 + 0x88))) {
          local_1 = false;
        }
        else {
          if (*(int *)(*in_RDI + 0x20) == 0) {
            highsLogDev((HighsLogOptions *)(uVar4 + 0x380),kInfo,"Reached time limit\n");
            *(undefined4 *)(*in_RDI + 0x20) = 0xd;
          }
          local_1 = true;
        }
      }
      else {
        if (*(int *)(*in_RDI + 0x20) == 0) {
          highsLogDev((HighsLogOptions *)(uVar4 + 0x380),kInfo,"Reached improving solution limit\n")
          ;
          *(undefined4 *)(*in_RDI + 0x20) = 0x10;
        }
        local_1 = true;
      }
    }
    else {
      if (*(int *)(*in_RDI + 0x20) == 0) {
        highsLogDev((HighsLogOptions *)(uVar4 + 0x380),kInfo,"Reached leaf node limit\n");
        *(undefined4 *)(*in_RDI + 0x20) = 0x10;
      }
      local_1 = true;
    }
  }
  else {
    if (*(int *)(*in_RDI + 0x20) == 0) {
      highsLogDev((HighsLogOptions *)(uVar4 + 0x380),kInfo,"Reached node limit\n");
      *(undefined4 *)(*in_RDI + 0x20) = 0x10;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool HighsMipSolverData::checkLimits(int64_t nodeOffset) const {
  const HighsOptions& options = *mipsolver.options_mip_;

  // Possible user interrupt
  if (!mipsolver.submip && mipsolver.callback_->user_callback) {
    mipsolver.callback_->clearHighsCallbackDataOut();
    if (interruptFromCallbackWithData(kCallbackMipInterrupt,
                                      mipsolver.solution_objective_,
                                      "MIP check limits")) {
      if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
        highsLogDev(options.log_options, HighsLogType::kInfo,
                    "User interrupt\n");
        mipsolver.modelstatus_ = HighsModelStatus::kInterrupt;
      }
      return true;
    }
  }
  // Possible termination due to objective being at least as good as
  // the target value
  if (!mipsolver.submip && mipsolver.solution_objective_ < kHighsInf &&
      options.objective_target > -kHighsInf) {
    // Note:
    //
    // Whether the sense is ObjSense::kMinimize or
    // ObjSense::kMaximize, the undefined value of
    // mipsolver.solution_objective_ is kHighsInf, and the default
    // target value is -kHighsInf, so had to rule out these cases in
    // the conditional statement above.
    //
    // mipsolver.solution_objective_ is the actual objective of the
    // MIP - including the offset, and independent of objective sense
    //
    // The target is reached if the objective is below (above) the
    // target value when minimizing (maximizing).
    const int int_sense = int(this->mipsolver.orig_model_->sense_);
    const bool reached_objective_target =
        int_sense * mipsolver.solution_objective_ <
        int_sense * options.objective_target;
    if (reached_objective_target) {
      if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
        highsLogDev(options.log_options, HighsLogType::kInfo,
                    "Reached objective target\n");
        mipsolver.modelstatus_ = HighsModelStatus::kObjectiveTarget;
      }
      return true;
    }
  }

  if (options.mip_max_nodes != kHighsIInf &&
      num_nodes + nodeOffset >= options.mip_max_nodes) {
    if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Reached node limit\n");
      mipsolver.modelstatus_ = HighsModelStatus::kSolutionLimit;
    }
    return true;
  }

  if (options.mip_max_leaves != kHighsIInf &&
      num_leaves >= options.mip_max_leaves) {
    if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Reached leaf node limit\n");
      mipsolver.modelstatus_ = HighsModelStatus::kSolutionLimit;
    }
    return true;
  }

  if (options.mip_max_improving_sols != kHighsIInf &&
      numImprovingSols >= options.mip_max_improving_sols) {
    if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Reached improving solution limit\n");
      mipsolver.modelstatus_ = HighsModelStatus::kSolutionLimit;
    }
    return true;
  }

  //  const double time = mipsolver.timer_.read();
  //  printf("checkLimits: time = %g\n", time);
  if (options.time_limit < kHighsInf &&
      mipsolver.timer_.read() >= options.time_limit) {
    if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Reached time limit\n");
      mipsolver.modelstatus_ = HighsModelStatus::kTimeLimit;
    }
    return true;
  }

  return false;
}